

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPointAction,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcStructuralAction *this;
  
  this = (IfcStructuralAction *)operator_new(0x1a0);
  *(undefined ***)&this->field_0x188 = &PTR__Object_00836880;
  *(undefined8 *)&this[1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject = 0;
  *(char **)&this[1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x8 =
       "IfcStructuralPointAction";
  Assimp::IFC::Schema_2x3::IfcStructuralAction::IfcStructuralAction
            (this,&PTR_construction_vtable_24__008ed978);
  *(undefined ***)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject =
       &PTR__IfcStructuralPointAction_008ed848;
  *(undefined ***)&this->field_0x188 = &PTR__IfcStructuralPointAction_008ed960;
  *(undefined ***)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x88 =
       &PTR__IfcStructuralPointAction_008ed870;
  (this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcStructuralPointAction_008ed898;
  *(undefined ***)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0xd0 =
       &PTR__IfcStructuralPointAction_008ed8c0;
  *(undefined ***)&(this->super_IfcStructuralActivity).super_IfcProduct.field_0x100 =
       &PTR__IfcStructuralPointAction_008ed8e8;
  *(undefined ***)&(this->super_IfcStructuralActivity).field_0x138 =
       &PTR__IfcStructuralPointAction_008ed910;
  *(undefined ***)&this->field_0x178 = &PTR__IfcStructuralPointAction_008ed938;
  GenericFill<Assimp::IFC::Schema_2x3::IfcStructuralPointAction>
            (db,params,(IfcStructuralPointAction *)this);
  return (Object *)
         (&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject +
                  -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }